

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O2

int X509_REQ_add0_attr(X509_REQ *req,X509_ATTRIBUTE *attr)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  
  sk = (OPENSSL_STACK *)req->req_info->attributes;
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = OPENSSL_sk_new_null();
    req->req_info->attributes = (stack_st_X509_ATTRIBUTE *)sk;
    if (sk == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar1 = OPENSSL_sk_push(sk,attr);
  return (uint)(sVar1 != 0);
}

Assistant:

static int X509_REQ_add0_attr(X509_REQ *req, X509_ATTRIBUTE *attr) {
  if (req->req_info->attributes == NULL) {
    req->req_info->attributes = sk_X509_ATTRIBUTE_new_null();
  }
  if (req->req_info->attributes == NULL ||
      !sk_X509_ATTRIBUTE_push(req->req_info->attributes, attr)) {
    return 0;
  }

  return 1;
}